

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void __thiscall
DBlockThingsIterator::DBlockThingsIterator
          (DBlockThingsIterator *this,AActor *origin,double checkradius,bool ignorerestricted)

{
  bool ignorerestricted_local;
  double checkradius_local;
  AActor *origin_local;
  DBlockThingsIterator *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f7f58;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&this->super_FMultiBlockThingsIterator,&this->check,origin,checkradius,ignorerestricted
            );
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f7f58;
  FPortalGroupArray::FPortalGroupArray(&this->check,1);
  FMultiBlockThingsIterator::CheckResult::CheckResult(&this->cres);
  (this->cres).thing = (AActor *)0x0;
  TVector3<double>::Zero(&(this->cres).Position);
  (this->cres).portalflags = 0;
  return;
}

Assistant:

DBlockThingsIterator(AActor *origin = nullptr, double checkradius = -1, bool ignorerestricted = false)
		: FMultiBlockThingsIterator(check, origin, checkradius, ignorerestricted)
	{
		cres.thing = nullptr;
		cres.Position.Zero();
		cres.portalflags = 0;
	}